

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O2

TestObject * __thiscall StressTester::CreateLinkedList(StressTester *this)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  Recycler *pRVar4;
  Recycler *pRVar5;
  int iVar6;
  Recycler *recycler;
  Recycler *this_00;
  
  recycler = this->recycler;
  sVar3 = GetRandomSize(this);
  iVar6 = 0;
  pRVar4 = (Recycler *)TestObject::Create(recycler,1,sVar3,NormalObj);
  iVar1 = PAL_rand();
  iVar1 = iVar1 % 100;
  iVar2 = iVar1 + -1;
  this_00 = pRVar4;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    pRVar5 = this->recycler;
    sVar3 = GetRandomSize((StressTester *)recycler);
    pRVar5 = (Recycler *)TestObject::Create(pRVar5,(uint)(iVar2 != iVar6),sVar3,NormalObj);
    TestObject::Add((TestObject *)this_00,(TestObject *)pRVar5);
    recycler = this_00;
    this_00 = pRVar5;
  }
  return (TestObject *)pRVar4;
}

Assistant:

TestObject* StressTester::CreateLinkedList()
{
    TestObject *root = TestObject::Create(recycler, 1, GetRandomSize());
    TestObject *curr = root;
    int length = rand() % MaxLinkedListLength;
    for (int i = 0; i < length; ++i)
    {
        CreateOptions options = (i == length - 1) ? LeafObj : NormalObj;
        TestObject *next = TestObject::Create(recycler, options == LeafObj ? 0 : 1, GetRandomSize());
        curr->Add(next);
        curr = next;
    }
    return root;
}